

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O0

void __thiscall w3Stack::DumpStack(w3Stack *this,PCSTR prefix)

{
  reference pwVar1;
  PCSTR pcVar2;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_40;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_38;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_30;
  size_t local_28;
  size_t i;
  size_t n;
  PCSTR prefix_local;
  w3Stack *this_local;
  
  n = (size_t)prefix;
  prefix_local = (PCSTR)this;
  i = size(this);
  printf("stack@%s: %lX ",n,i);
  for (local_28 = 0; local_28 != i; local_28 = local_28 + 1) {
    local_30._M_current = (w3StackValue *)begin(this);
    pwVar1 = __gnu_cxx::
             __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
             ::operator[](&local_30,local_28);
    pcVar2 = TagToString((uint)pwVar1->tag);
    printf("%s:",pcVar2);
    local_38._M_current = (w3StackValue *)begin(this);
    pwVar1 = __gnu_cxx::
             __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
             ::operator[](&local_38,local_28);
    if (pwVar1->tag == Tag_Value) {
      local_40._M_current = (w3StackValue *)begin(this);
      pwVar1 = __gnu_cxx::
               __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
               ::operator[](&local_40,local_28);
      pcVar2 = TagToString((uint)(pwVar1->value).tag);
      printf("%s",pcVar2);
    }
    printf(" ");
  }
  printf("\n");
  return;
}

Assistant:

void DumpStack (PCSTR prefix)
    {
        const size_t n = size ();
        printf ("stack@%s: %" FORMAT_SIZE "X ", prefix, n);
        for (size_t i = 0; i != n; ++i)
        {
            printf ("%s:", TagToString (begin () [(ssize_t)i].tag));
            switch (begin () [(ssize_t)i].tag)
            {
            case Tag_Label:
                break;
            case Tag_Frame:
                break;
            case Tag_Value:
                printf ("%s", TagToString (begin () [(ssize_t)i].value.tag));
                break;
            default:; //todo
            }
            printf (" ");
        }
        printf ("\n");
    }